

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O0

void __thiscall dummy_api::set_response_headers(dummy_api *this,response_headers *h)

{
  string *psVar1;
  undefined8 in_RSI;
  undefined1 complete;
  string_buffer_wrapper *in_RDI;
  response_headers *unaff_retaddr;
  string_buffer_wrapper wr;
  string_buffer_wrapper *in_stack_ffffffffffffffc0;
  string_buffer_wrapper local_30;
  string_buffer_wrapper *io;
  
  complete = (undefined1)((ulong)in_RSI >> 0x38);
  io = in_RDI;
  cppcms::impl::response_headers::string_buffer_wrapper::string_buffer_wrapper
            (in_stack_ffffffffffffffc0,(size_t)&local_30);
  cppcms::impl::response_headers::
  format_cgi_headers<cppcms::impl::response_headers::string_buffer_wrapper>
            (unaff_retaddr,io,(bool)complete);
  psVar1 = cppcms::impl::response_headers::string_buffer_wrapper::data_abi_cxx11_(&local_30);
  std::__cxx11::string::operator=((string *)&in_RDI[8].field_0x10,(string *)psVar1);
  cppcms::impl::response_headers::string_buffer_wrapper::~string_buffer_wrapper
            ((string_buffer_wrapper *)0x126352);
  return;
}

Assistant:

virtual void set_response_headers(cppcms::impl::response_headers &h) 
	{
		cppcms::impl::response_headers::string_buffer_wrapper wr;
		h.format_cgi_headers(wr,true);
		headers_ = wr.data();
	}